

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cpp
# Opt level: O0

int __thiscall Board::countStonesFor(Board *this,Player *p)

{
  bool bVar1;
  Cell *this_00;
  int local_24;
  int local_20;
  int col;
  int row;
  int count;
  Player *p_local;
  Board *this_local;
  
  col = 0;
  for (local_20 = 0; local_20 < this->size; local_20 = local_20 + 1) {
    for (local_24 = 0; local_24 < this->size; local_24 = local_24 + 1) {
      this_00 = getCell(this,local_20,local_24);
      bVar1 = Cell::belongsTo(this_00,p);
      if (bVar1) {
        col = col + 1;
      }
    }
  }
  return col;
}

Assistant:

int Board::countStonesFor(const Player *p){

    int count=0;
    for (int row=0; row<size; row++){
        for (int col=0; col<size; col++){
            if (getCell(row,col).belongsTo(p)){
                count++;
            }
        }
    }
    return count;
}